

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtWrenchesAndJointTorquesEstimator.cpp
# Opt level: O0

bool __thiscall
iDynTree::ExtWrenchesAndJointTorquesEstimator::estimateExtWrenchesAndJointTorques
          (ExtWrenchesAndJointTorquesEstimator *this,LinkUnknownWrenchContacts *unknowns,
          SensorsMeasurements *ftSensorsMeasures,LinkContactWrenches *estimateContactWrenches,
          JointDOFsDoubleArray *jointTorques)

{
  bool bVar1;
  LinkWrenches *in_RCX;
  FreeFloatingGeneralizedTorques *in_RDX;
  Model *pMVar2;
  Model *in_RDI;
  bool ok;
  LinkVelArray *in_stack_00000180;
  JointPosDoubleArray *in_stack_00000188;
  LinkUnknownWrenchContacts *in_stack_00000190;
  SensorsList *in_stack_00000198;
  SubModelDecomposition *in_stack_000001a0;
  Model *in_stack_000001a8;
  LinkAccArray *in_stack_000001c0;
  SensorsMeasurements *in_stack_000001c8;
  estimateExternalWrenchesBuffers *in_stack_000001d0;
  LinkContactWrenches *in_stack_000001d8;
  byte local_52;
  byte local_51;
  bool local_9;
  
  if (((byte)in_RDI[0x160] & 1) == 0) {
    iDynTree::reportError
              ("ExtWrenchesAndJointTorquesEstimator","estimateExtWrenchesAndJointTorques",
               "Model and sensors information not set.");
    local_9 = false;
  }
  else if (((byte)in_RDI[0x161] & 1) == 0) {
    iDynTree::reportError
              ("ExtWrenchesAndJointTorquesEstimator","estimateExtWrenchesAndJointTorques",
               "Kinematic information not set.");
    local_9 = false;
  }
  else {
    iDynTree::Model::sensors();
    pMVar2 = in_RDI + 600;
    bVar1 = estimateExternalWrenches
                      (in_stack_000001a8,in_stack_000001a0,in_stack_00000198,in_stack_00000190,
                       in_stack_00000188,in_stack_00000180,in_stack_000001c0,in_stack_000001c8,
                       in_stack_000001d0,in_stack_000001d8);
    if (bVar1) {
      local_51 = 0;
      if (bVar1) {
        local_51 = iDynTree::LinkContactWrenches::computeNetWrenches(in_RCX);
      }
      if ((local_51 & 1) == 0) {
        iDynTree::reportError
                  ("ExtWrenchesAndJointTorquesEstimator","estimateExtWrenchesAndJointTorques",
                   "Error in computing the net external wrenches from the estimated contact forces")
        ;
        local_9 = false;
      }
      else {
        local_52 = 0;
        if ((local_51 & 1) != 0) {
          pMVar2 = in_RDI + 0x288;
          in_RDX = (FreeFloatingGeneralizedTorques *)(in_RDI + 0x2a0);
          local_52 = iDynTree::RNEADynamicPhase
                               (in_RDI,(Traversal *)(in_RDI + 0x168),
                                (JointPosDoubleArray *)(in_RDI + 0x1e0),
                                (LinkVelArray *)(in_RDI + 0x240),(LinkAccArray *)(in_RDI + 600),
                                (LinkWrenches *)(in_RDI + 0x270),(LinkWrenches *)pMVar2,in_RDX);
        }
        local_9 = (bool)(local_52 & 1);
        if (local_9 == false) {
          iDynTree::reportError
                    ("ExtWrenchesAndJointTorquesEstimator","estimateExtWrenchesAndJointTorques",
                     "Error in computing the dynamic phase of the RNEA.");
          local_9 = false;
        }
        else {
          iDynTree::FreeFloatingGeneralizedTorques::jointTorques();
          JointDOFsDoubleArray::operator=
                    ((JointDOFsDoubleArray *)in_RDX,(JointDOFsDoubleArray *)pMVar2);
        }
      }
    }
    else {
      iDynTree::reportError
                ("ExtWrenchesAndJointTorquesEstimator","estimateExtWrenchesAndJointTorques",
                 "Error in estimating the external contact wrenches");
      local_9 = false;
    }
  }
  return local_9;
}

Assistant:

bool ExtWrenchesAndJointTorquesEstimator::estimateExtWrenchesAndJointTorques(const LinkUnknownWrenchContacts& unknowns,
                                                                             const SensorsMeasurements& ftSensorsMeasures,
                                                                                   LinkContactWrenches& estimateContactWrenches,
                                                                                   JointDOFsDoubleArray& jointTorques)
{
    if( !m_isModelValid )
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","estimateExtWrenchesAndJointTorques",
                    "Model and sensors information not set.");
        return false;
    }

    if( !m_isKinematicsUpdated )
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","estimateExtWrenchesAndJointTorques",
                    "Kinematic information not set.");
        return false;
    }

    /**
     * Compute external forces
     */
    bool ok = estimateExternalWrenches(m_model,m_submodels,m_model.sensors(),
                                       unknowns,m_jointPos,m_linkVels,m_linkProperAccs,
                                       ftSensorsMeasures,m_bufs,estimateContactWrenches);

    if( !ok )
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","estimateExtWrenchesAndJointTorques",
                    "Error in estimating the external contact wrenches");
        return false;
    }

    /**
     * Compute net external wrenches
     */
    ok = ok && estimateContactWrenches.computeNetWrenches(m_linkNetExternalWrenches);

    if( !ok )
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","estimateExtWrenchesAndJointTorques",
                    "Error in computing the net external wrenches from the estimated contact forces");
        return false;
    }

    /**
     * Compute joint torques
     */
    ok = ok && RNEADynamicPhase(m_model,m_dynamicTraversal,m_jointPos,m_linkVels,m_linkProperAccs,
                                m_linkNetExternalWrenches,m_linkIntWrenches,m_generalizedTorques);

    if( !ok )
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","estimateExtWrenchesAndJointTorques",
                    "Error in computing the dynamic phase of the RNEA.");
        return false;
    }

    /**
     * Copy the joint torques computed by the RNEA to the output
     */
    jointTorques = m_generalizedTorques.jointTorques();

    return ok;
}